

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

Message * __thiscall helics::MessageHolder::newMessage(MessageHolder *this)

{
  pointer piVar1;
  pointer puVar2;
  Message *pMVar3;
  __uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> __p;
  tuple<helics::Message_*,_std::default_delete<helics::Message>_> in_RAX;
  pointer puVar4;
  int iVar5;
  __uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> local_28;
  
  piVar1 = (this->freeMessageSlots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->freeMessageSlots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start == piVar1) {
    std::make_unique<helics::Message>();
    std::
    vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
    ::emplace_back<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
              ((vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
                *)this,(unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                       &local_28);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_28);
    puVar2 = (this->messages).
             super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar4 = puVar2 + -1;
    iVar5 = (int)((ulong)((long)puVar2 -
                         (long)(this->messages).
                               super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  }
  else {
    iVar5 = piVar1[-1];
    (this->freeMessageSlots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1 + -1;
    local_28._M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
    super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
         in_RAX.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
         super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
    std::make_unique<helics::Message>();
    __p._M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
    super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
         local_28._M_t.
         super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
         super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
    local_28._M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
    super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
         (_Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>)0x0;
    std::__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>::reset
              ((__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> *)
               ((this->messages).
                super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + iVar5),
               (pointer)__p._M_t.
                        super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                        .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_28);
    puVar4 = (this->messages).
             super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar5;
  }
  pMVar3 = (puVar4->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  pMVar3->counter = iVar5;
  pMVar3->messageValidation = 0xb3;
  pMVar3->backReference = this;
  return pMVar3;
}

Assistant:

Message* MessageHolder::newMessage()
{
    Message* message{nullptr};
    if (!freeMessageSlots.empty()) {
        auto index = freeMessageSlots.back();
        freeMessageSlots.pop_back();
        messages[index] = std::make_unique<Message>();
        message = messages[index].get();
        message->counter = index;

    } else {
        messages.push_back(std::make_unique<Message>());
        message = messages.back().get();
        message->counter = static_cast<int32_t>(messages.size()) - 1;
    }

    message->messageValidation = messageKeyCode;
    message->backReference = static_cast<void*>(this);
    return message;
}